

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> * __thiscall
embree::XMLLoader::loadVec4iArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *this_00;
  long *in_RDX;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *in_RDI;
  Ref<embree::XML> *in_stack_00000088;
  XMLLoader *in_stack_00000090;
  size_t i;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *data;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe50;
  XML *in_stack_fffffffffffffe58;
  Token *in_stack_fffffffffffffe60;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  ParseLocation *in_stack_fffffffffffffeb8;
  ulong local_140;
  string local_110 [35];
  undefined1 local_ed;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  long *local_98;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  int *local_40;
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_10;
  reference local_8;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::vector
              ((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)0x387241);
  }
  else {
    local_98 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"ofs",&local_d9);
    XML::parm(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    bVar1 = std::operator!=(in_stack_fffffffffffffe10,
                            (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    if (bVar1) {
      loadBinary<std::vector<embree::Vec4<int>,std::allocator<embree::Vec4<int>>>>
                (in_stack_00000090,in_stack_00000088);
    }
    else {
      local_ed = 0;
      std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::vector
                ((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)0x3873a0);
      local_50 = local_98;
      sVar3 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98)
                        );
      if ((sVar3 & 3) != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_58 = local_98;
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffeb8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       (char *)in_stack_fffffffffffffe10);
        std::runtime_error::runtime_error(this_00,local_110);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_60 = local_98;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98));
      std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::resize
                (in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      for (local_140 = 0;
          sVar3 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::size(in_RDI),
          local_140 < sVar3; local_140 = local_140 + 1) {
        local_68 = local_98;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98),
                   local_140 << 2);
        local_154 = Token::Int(in_stack_fffffffffffffe60);
        local_70 = local_98;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98),
                   local_140 * 4 + 1);
        local_158 = Token::Int(in_stack_fffffffffffffe60);
        local_78 = local_98;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98),
                   local_140 * 4 + 2);
        local_15c = Token::Int(in_stack_fffffffffffffe60);
        local_80 = local_98;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_98 + 0x98),
                   local_140 * 4 + 3);
        iVar2 = Token::Int(in_stack_fffffffffffffe60);
        local_20 = &local_150;
        local_28 = &local_154;
        local_30 = &local_158;
        local_38 = &local_15c;
        local_40 = &local_160;
        local_150 = local_154;
        local_14c = local_158;
        local_160 = iVar2;
        local_8 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                            (in_RDI,local_140);
        local_10 = &local_150;
        (local_8->field_0).field_0.x = local_150;
        (local_8->field_0).field_0.y = local_14c;
        (local_8->field_0).field_0.z = (int)in_stack_fffffffffffffeb8;
        (local_8->field_0).field_0.w = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vec4i> XMLLoader::loadVec4iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec4i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec4i>>(xml);
    } 
    else 
    {
      std::vector<Vec4i> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec4i(xml->body[4*i+0].Int(),xml->body[4*i+1].Int(),xml->body[4*i+2].Int(),xml->body[4*i+3].Int());
      return data;
    }
  }